

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varinfo.c
# Opt level: O2

int varinfo_set_feature(varinfo *info,char *feature)

{
  vardata_feature *pvVar1;
  int iVar2;
  undefined8 in_RAX;
  int data;
  
  data = (int)((ulong)in_RAX >> 0x20);
  iVar2 = symtab_get_t(info->data->symtab,feature,0,&data);
  if (iVar2 == -1) {
    fprintf(_stderr,"no feature %s\n",feature);
  }
  else {
    iVar2 = mask_intersect(info->data->features[data].cfmask,info->fmask,info->data->featuresnum);
    pvVar1 = info->data->features;
    if (iVar2 == -1) {
      mask_or(info->fmask,pvVar1[data].ifmask,info->data->featuresnum);
      return 0;
    }
    fprintf(_stderr,"feature %s conflicts with already set feature %s\n",pvVar1[data].name,
            pvVar1[iVar2].name);
  }
  return -1;
}

Assistant:

int varinfo_set_feature(struct varinfo *info, const char *feature) {
	int data;
	if (symtab_get_t(info->data->symtab, feature, VARDATA_ST_FEATURE, &data) == -1) {
		fprintf(stderr, "no feature %s\n", feature);
		return -1;
	}
	int cf;
	if ((cf = mask_intersect(info->data->features[data].cfmask, info->fmask, info->data->featuresnum)) != -1) {
		fprintf(stderr, "feature %s conflicts with already set feature %s\n", info->data->features[data].name, info->data->features[cf].name);
		return -1;
	}
	mask_or(info->fmask, info->data->features[data].ifmask, info->data->featuresnum);
	return 0;
}